

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhdp_interfaces.c
# Opt level: O2

void nhdp_interfaces_cleanup(void)

{
  list_entity *plVar1;
  list_entity *plVar2;
  
  plVar1 = _interface_tree.list_head.next;
  while (plVar2 = plVar1, plVar2->prev != _interface_tree.list_head.prev) {
    plVar1 = plVar2->next;
    if (*(char *)&plVar2[0xe].prev == '\x01') {
      nhdp_interface_remove((nhdp_interface *)&plVar2[-0x16].prev);
    }
  }
  oonf_timer_remove(&_interface_hello_timer);
  oonf_timer_remove(&_removed_address_hold_timer);
  oonf_class_remove(&_interface_info);
  oonf_class_remove(&_addr_info);
  return;
}

Assistant:

void
nhdp_interfaces_cleanup(void) {
  struct nhdp_interface *interf, *if_it;

  avl_for_each_element_safe(&_interface_tree, interf, _node, if_it) {
    if (interf->registered) {
      nhdp_interface_remove(interf);
    }
  }

  oonf_timer_remove(&_interface_hello_timer);
  oonf_timer_remove(&_removed_address_hold_timer);
  oonf_class_remove(&_interface_info);
  oonf_class_remove(&_addr_info);
}